

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::ExtensionRangeOptions::SharedDtor(MessageLite *self)

{
  FeatureSet *this;
  ulong uVar1;
  
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
    uVar1 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (FeatureSet *)self[6]._vptr_MessageLite;
    if (this != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(this);
    }
    operator_delete(this,0x50);
    RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)
               &self[4]._internal_metadata_);
    RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)(self + 3));
    internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  SharedDtor((ExtensionRangeOptions *)&stack0xffffffffffffffd8);
}

Assistant:

inline void ExtensionRangeOptions::SharedDtor(MessageLite& self) {
  ExtensionRangeOptions& this_ = static_cast<ExtensionRangeOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.features_;
  this_._impl_.~Impl_();
}